

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t1dec.c
# Opt level: O0

int jpc_dec_decodecblks(jpc_dec_t *dec,jpc_dec_tile_t *tile)

{
  int iVar1;
  int local_6c;
  jpc_dec_cblk_t *pjStack_68;
  int cblkcnt;
  jpc_dec_cblk_t *cblk;
  jpc_dec_prc_t *pjStack_58;
  int prccnt;
  jpc_dec_prc_t *prc;
  jpc_dec_band_t *pjStack_48;
  int bandcnt;
  jpc_dec_band_t *band;
  jpc_dec_rlvl_t *pjStack_38;
  int rlvlcnt;
  jpc_dec_rlvl_t *rlvl;
  jpc_dec_tcomp_t *pjStack_28;
  int compcnt;
  jpc_dec_tcomp_t *tcomp;
  jpc_dec_tile_t *tile_local;
  jpc_dec_t *dec_local;
  
  rlvl._4_4_ = dec->numcomps;
  pjStack_28 = tile->tcomps;
  do {
    if (rlvl._4_4_ < 1) {
      return 0;
    }
    pjStack_38 = pjStack_28->rlvls;
    for (band._4_4_ = pjStack_28->numrlvls; 0 < (int)band._4_4_; band._4_4_ = band._4_4_ - 1) {
      if (pjStack_38->bands != (jpc_dec_band_t *)0x0) {
        pjStack_48 = pjStack_38->bands;
        for (prc._4_4_ = pjStack_38->numbands; 0 < prc._4_4_; prc._4_4_ = prc._4_4_ + -1) {
          if (pjStack_48->data != (jas_matrix_t *)0x0) {
            pjStack_58 = pjStack_48->prcs;
            for (cblk._4_4_ = pjStack_38->numprcs; 0 < cblk._4_4_; cblk._4_4_ = cblk._4_4_ + -1) {
              if (pjStack_58->cblks != (jpc_dec_cblk_t *)0x0) {
                pjStack_68 = pjStack_58->cblks;
                for (local_6c = pjStack_58->numcblks; 0 < local_6c; local_6c = local_6c + -1) {
                  iVar1 = jpc_dec_decodecblk(dec,tile,pjStack_28,pjStack_48,pjStack_68,1,0x4000);
                  if (iVar1 != 0) {
                    return -1;
                  }
                  pjStack_68 = pjStack_68 + 1;
                }
              }
              pjStack_58 = pjStack_58 + 1;
            }
          }
          pjStack_48 = pjStack_48 + 1;
        }
      }
      pjStack_38 = pjStack_38 + 1;
    }
    rlvl._4_4_ = rlvl._4_4_ + -1;
    pjStack_28 = pjStack_28 + 1;
  } while( true );
}

Assistant:

int jpc_dec_decodecblks(jpc_dec_t *dec, jpc_dec_tile_t *tile)
{
	jpc_dec_tcomp_t *tcomp;
	int compcnt;
	jpc_dec_rlvl_t *rlvl;
	int rlvlcnt;
	jpc_dec_band_t *band;
	int bandcnt;
	jpc_dec_prc_t *prc;
	int prccnt;
	jpc_dec_cblk_t *cblk;
	int cblkcnt;

	for (compcnt = dec->numcomps, tcomp = tile->tcomps; compcnt > 0;
	  --compcnt, ++tcomp) {
		for (rlvlcnt = tcomp->numrlvls, rlvl = tcomp->rlvls;
		  rlvlcnt > 0; --rlvlcnt, ++rlvl) {
			if (!rlvl->bands) {
				continue;
			}
			for (bandcnt = rlvl->numbands, band = rlvl->bands;
			  bandcnt > 0; --bandcnt, ++band) {
				if (!band->data) {
					continue;
				}
				for (prccnt = rlvl->numprcs, prc = band->prcs;
				  prccnt > 0; --prccnt, ++prc) {
					if (!prc->cblks) {
						continue;
					}
					for (cblkcnt = prc->numcblks,
					  cblk = prc->cblks; cblkcnt > 0;
					  --cblkcnt, ++cblk) {
						if (jpc_dec_decodecblk(dec, tile, tcomp,
						  band, cblk, 1, JPC_MAXLYRS)) {
							return -1;
						}
					}
				}

			}
		}
	}

	return 0;
}